

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall
wallet::CWallet::DelAddressBookWithDB(CWallet *this,WalletBatch *batch,CTxDestination *address)

{
  bool bVar1;
  isminetype iVar2;
  char *wallet_fmt;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>,_std::_Rb_tree_iterator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
  pVar3;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock52;
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  EncodeDestination_abi_cxx11_((string *)(local_58 + 0x10),address);
  local_68._0_8_ = &this->cs_wallet;
  local_68[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_68);
  iVar2 = IsMine(this,address);
  if (iVar2 == ISMINE_NO) {
    bVar1 = WalletBatch::EraseAddressData(batch,address);
    if (bVar1) {
      bVar1 = WalletBatch::ErasePurpose(batch,(string *)(local_58 + 0x10));
      if (bVar1) {
        bVar1 = WalletBatch::EraseName(batch,(string *)(local_58 + 0x10));
        if (bVar1) {
          pVar3 = std::
                  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
                  ::equal_range(&(this->m_address_book)._M_t,address);
          bVar1 = true;
          std::
          _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
          ::_M_erase_aux(&(this->m_address_book)._M_t,(_Base_ptr)pVar3.first._M_node,
                         (_Base_ptr)pVar3.second._M_node);
          goto LAB_005234c2;
        }
        wallet_fmt = "Error: cannot erase address book entry name\n";
      }
      else {
        wallet_fmt = "Error: cannot erase address book entry purpose\n";
      }
    }
    else {
      wallet_fmt = "Error: cannot erase address book entry data\n";
    }
    WalletLogPrintf<>(this,(ConstevalFormatString<0U>)wallet_fmt);
  }
  else {
    WalletLogPrintf<char[21],char[42]>
              (this,(ConstevalFormatString<2U>)0x842be1,(char (*) [21])"DelAddressBookWithDB",
               (char (*) [42])"https://github.com/bitcoin/bitcoin/issues");
  }
  bVar1 = false;
LAB_005234c2:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_68);
  if (bVar1 != false) {
    local_68._0_8_ = (RecursiveMutex *)local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"");
    boost::signals2::
    signal<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::signals2::mutex>
    ::operator()(&this->NotifyAddressBookChanged,address,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,false
                 ,SEND,CT_DELETED);
    if ((RecursiveMutex *)local_68._0_8_ != (RecursiveMutex *)local_58) {
      operator_delete((void *)local_68._0_8_,local_58._0_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._16_8_ != &local_38) {
    operator_delete((void *)local_58._16_8_,(ulong)(local_38._M_allocated_capacity + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::DelAddressBookWithDB(WalletBatch& batch, const CTxDestination& address)
{
    const std::string& dest = EncodeDestination(address);
    {
        LOCK(cs_wallet);
        // If we want to delete receiving addresses, we should avoid calling EraseAddressData because it will delete the previously_spent value. Could instead just erase the label so it becomes a change address, and keep the data.
        // NOTE: This isn't a problem for sending addresses because they don't have any data that needs to be kept.
        // When adding new address data, it should be considered here whether to retain or delete it.
        if (IsMine(address)) {
            WalletLogPrintf("%s called with IsMine address, NOT SUPPORTED. Please report this bug! %s\n", __func__, PACKAGE_BUGREPORT);
            return false;
        }
        // Delete data rows associated with this address
        if (!batch.EraseAddressData(address)) {
            WalletLogPrintf("Error: cannot erase address book entry data\n");
            return false;
        }

        // Delete purpose entry
        if (!batch.ErasePurpose(dest)) {
            WalletLogPrintf("Error: cannot erase address book entry purpose\n");
            return false;
        }

        // Delete name entry
        if (!batch.EraseName(dest)) {
            WalletLogPrintf("Error: cannot erase address book entry name\n");
            return false;
        }

        // finally, remove it from the map
        m_address_book.erase(address);
    }

    // All good, signal changes
    NotifyAddressBookChanged(address, "", /*is_mine=*/false, AddressPurpose::SEND, CT_DELETED);
    return true;
}